

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execNegEa<(moira::Instr)86,(moira::Mode)7,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 data;
  u32 ea;
  u32 local_10;
  u32 local_c;
  
  bVar1 = readOp<(moira::Mode)7,(moira::Size)4,0ul>(this,opcode & 7,&local_c,&local_10);
  if (bVar1) {
    local_10 = logic<(moira::Instr)86,(moira::Size)4>(this,local_10);
    prefetch<0ul>(this);
    writeM<(moira::MemSpace)1,(moira::Size)4,4ul>(this,local_c,local_10);
  }
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}